

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

void __thiscall
ON_SubDManagedMeshFragment::CopyHelper(ON_SubDManagedMeshFragment *this,ON_SubDMeshFragment *src)

{
  unsigned_short *puVar1;
  double *pdVar2;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar3;
  undefined2 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  uint *puVar10;
  uint *puVar11;
  ON_SubDMeshFragmentGrid *pOVar12;
  ON_SubDMeshFragmentGrid *pOVar13;
  ON_3dVector quad_normal;
  bool bVar14;
  byte bVar15;
  bool bVar16;
  bool bVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  unsigned_short uVar21;
  unsigned_short uVar22;
  unsigned_short uVar23;
  ON__UINT16 OVar24;
  ON__UINT32 OVar25;
  bool bVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  double *pdVar31;
  ON_SurfaceCurvature *pOVar32;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar33;
  char *sFormat;
  double *pdVar34;
  ON_SurfaceCurvature *pOVar35;
  ushort uVar36;
  size_t sVar37;
  int line_number;
  ON_SurfaceCurvature *pOVar38;
  double *pdVar39;
  ON_Color *pOVar40;
  size_t sVar41;
  uint uVar42;
  double nan3 [3];
  ON_3dVector local_b0;
  ON_3dPoint quad_points [4];
  ulong vertex_capacity;
  
  if (this != (ON_SubDManagedMeshFragment *)src) {
    ON_SubDMeshFragment::Clear(&this->super_ON_SubDMeshFragment);
    uVar42 = src->m_vertex_count_etc & 0x1fff;
    vertex_capacity = (ulong)uVar42;
    if ((src->m_vertex_count_etc & 0x1fff) != 0) {
      uVar27 = ON_SubDMeshFragment::PointCount(src);
      if ((uVar27 != 0) && (uVar27 != uVar42)) {
        ON_SubDIncrementErrorCount();
        sFormat = "invalid counts";
        line_number = 0x4a1;
LAB_0060883f:
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                   ,line_number,"",sFormat);
        return;
      }
      uVar28 = ON_SubDMeshFragment::NormalCount(src);
      bVar15 = 1;
      bVar14 = true;
      if (uVar28 != 0) {
        if (uVar28 == uVar42) {
          bVar14 = false;
        }
        else {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4a8,"","invalid src.NormalCount()");
          bVar14 = true;
        }
      }
      uVar28 = ON_SubDMeshFragment::TextureCoordinateCount(src);
      if (uVar28 != 0) {
        if (uVar28 == uVar42) {
          bVar15 = 0;
        }
        else {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4af,"","invalid src.TextureCoordinateCount()");
        }
      }
      uVar28 = ON_SubDMeshFragment::CurvatureCount(src);
      bVar17 = true;
      bVar16 = true;
      if (uVar28 != 0) {
        if (uVar28 == uVar42) {
          bVar16 = false;
        }
        else {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4b6,"","invalid src.CurvatureCount()");
          bVar16 = true;
        }
      }
      uVar28 = ON_SubDMeshFragment::ColorCount(src);
      if (uVar28 != 0) {
        if (uVar28 == uVar42) {
          bVar17 = false;
        }
        else {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4bd,"","invalid src.ColorCount()");
        }
      }
      uVar36 = (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc & 0x1fff;
      if (uVar36 < (ushort)uVar42) {
        bVar26 = ON_SubDMeshFragment::UnmanagedArrays(&this->super_ON_SubDMeshFragment);
        if (uVar36 != 0 && bVar26) {
          ON_SubDIncrementErrorCount();
          sFormat = "unmanaged array capacity is too small.";
          line_number = 0x4c6;
          goto LAB_0060883f;
        }
        bVar26 = ON_SubDMeshFragment::ManagedArrays(&this->super_ON_SubDMeshFragment);
        if (bVar26) {
          ON_SubDMeshFragment::DeleteManagedArrays(&this->super_ON_SubDMeshFragment);
        }
        (this->super_ON_SubDMeshFragment).m_vertex_count_etc = 0;
        (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc = 0;
        (this->super_ON_SubDMeshFragment).m_P = (double *)0x0;
        ON_SubDMeshFragment::Internal_LayoutArrays
                  (&this->super_ON_SubDMeshFragment,vertex_capacity,(double *)0x0);
      }
      uVar28 = ON_SubDMeshFragment::TextureCoordinateCapacity(&this->super_ON_SubDMeshFragment);
      uVar29 = ON_SubDMeshFragment::CurvatureCapacity(&this->super_ON_SubDMeshFragment);
      uVar30 = ON_SubDMeshFragment::ColorCapacity(&this->super_ON_SubDMeshFragment);
      ON_SubDMeshFragment::SetVertexCount(&this->super_ON_SubDMeshFragment,vertex_capacity);
      uVar4 = src->m_vertex_count_etc;
      (this->super_ON_SubDMeshFragment).m_vertex_count_etc =
           uVar4 & 0x8000 | (this->super_ON_SubDMeshFragment).m_vertex_count_etc & 0x7fff;
      bVar26 = (bool)(bVar15 | uVar28 < uVar42);
      if (!bVar26) {
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[0][0] = src->m_ctrlnetT[0][0];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[0][1] = src->m_ctrlnetT[0][1];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[0][2] = src->m_ctrlnetT[0][2];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[1][0] = src->m_ctrlnetT[1][0];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[1][1] = src->m_ctrlnetT[1][1];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[1][2] = src->m_ctrlnetT[1][2];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[2][0] = src->m_ctrlnetT[2][0];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[2][1] = src->m_ctrlnetT[2][1];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[2][2] = src->m_ctrlnetT[2][2];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[3][0] = src->m_ctrlnetT[3][0];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[3][1] = src->m_ctrlnetT[3][1];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[3][2] = src->m_ctrlnetT[3][2];
      }
      if (!bVar16 && uVar42 <= uVar29) {
        dVar5 = src->m_ctrlnetK[0].k2;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[0].k1 = src->m_ctrlnetK[0].k1;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[0].k2 = dVar5;
        dVar5 = src->m_ctrlnetK[1].k2;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[1].k1 = src->m_ctrlnetK[1].k1;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[1].k2 = dVar5;
        dVar5 = src->m_ctrlnetK[2].k2;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[2].k1 = src->m_ctrlnetK[2].k1;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[2].k2 = dVar5;
        dVar5 = src->m_ctrlnetK[3].k2;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[3].k1 = src->m_ctrlnetK[3].k1;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[3].k2 = dVar5;
      }
      if (!bVar17 && uVar42 <= uVar30) {
        (this->super_ON_SubDMeshFragment).m_ctrlnetC[0].field_0 = src->m_ctrlnetC[0].field_0;
        (this->super_ON_SubDMeshFragment).m_ctrlnetC[1].field_0 = src->m_ctrlnetC[1].field_0;
        (this->super_ON_SubDMeshFragment).m_ctrlnetC[2].field_0 = src->m_ctrlnetC[2].field_0;
        (this->super_ON_SubDMeshFragment).m_ctrlnetC[3].field_0 = src->m_ctrlnetC[3].field_0;
      }
      (this->super_ON_SubDMeshFragment).m_pack_rect[0][0] = src->m_pack_rect[0][0];
      (this->super_ON_SubDMeshFragment).m_pack_rect[0][1] = src->m_pack_rect[0][1];
      (this->super_ON_SubDMeshFragment).m_pack_rect[1][0] = src->m_pack_rect[1][0];
      (this->super_ON_SubDMeshFragment).m_pack_rect[1][1] = src->m_pack_rect[1][1];
      (this->super_ON_SubDMeshFragment).m_pack_rect[2][0] = src->m_pack_rect[2][0];
      (this->super_ON_SubDMeshFragment).m_pack_rect[2][1] = src->m_pack_rect[2][1];
      (this->super_ON_SubDMeshFragment).m_pack_rect[3][0] = src->m_pack_rect[3][0];
      (this->super_ON_SubDMeshFragment).m_pack_rect[3][1] = src->m_pack_rect[3][1];
      dVar5 = (src->m_surface_bbox).m_min.y;
      dVar6 = (src->m_surface_bbox).m_min.z;
      dVar7 = (src->m_surface_bbox).m_max.x;
      dVar8 = (src->m_surface_bbox).m_max.y;
      dVar9 = (src->m_surface_bbox).m_max.z;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_min.x = (src->m_surface_bbox).m_min.x;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_min.y = dVar5;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_min.z = dVar6;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_max.x = dVar7;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_max.y = dVar8;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_max.z = dVar9;
      uVar18 = (src->m_grid).m_reserved2;
      uVar19 = (src->m_grid).m_side_segment_count;
      uVar20 = (src->m_grid).m_reserved3;
      uVar21 = (src->m_grid).m_F_count;
      uVar22 = (src->m_grid).m_F_level_of_detail;
      uVar23 = (src->m_grid).m_F_stride;
      OVar24 = (src->m_grid).m_reserved4;
      OVar25 = (src->m_grid).m_reserved5;
      puVar10 = (src->m_grid).m_F;
      puVar11 = (src->m_grid).m_S;
      pOVar12 = (src->m_grid).m_prev_level_of_detail;
      pOVar13 = (src->m_grid).m_next_level_of_detail;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved1 = (src->m_grid).m_reserved1;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved2 = uVar18;
      (this->super_ON_SubDMeshFragment).m_grid.m_side_segment_count = uVar19;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved3 = uVar20;
      (this->super_ON_SubDMeshFragment).m_grid.m_F_count = uVar21;
      (this->super_ON_SubDMeshFragment).m_grid.m_F_level_of_detail = uVar22;
      (this->super_ON_SubDMeshFragment).m_grid.m_F_stride = uVar23;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved4 = OVar24;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved5 = OVar25;
      (this->super_ON_SubDMeshFragment).m_grid.m_F = puVar10;
      (this->super_ON_SubDMeshFragment).m_grid.m_S = puVar11;
      (this->super_ON_SubDMeshFragment).m_grid.m_prev_level_of_detail = pOVar12;
      (this->super_ON_SubDMeshFragment).m_grid.m_next_level_of_detail = pOVar13;
      ON_SubDMeshFragment::GetControlNetQuad(src,false,quad_points,&local_b0);
      quad_normal.y = local_b0.y;
      quad_normal.x = local_b0.x;
      quad_normal.z = local_b0.z;
      ON_SubDMeshFragment::SetControlNetQuad
                (&this->super_ON_SubDMeshFragment,false,quad_points,quad_normal);
      pdVar39 = nan3;
      nan3[0] = ON_DBL_QNAN;
      nan3[1] = ON_DBL_QNAN;
      nan3[2] = ON_DBL_QNAN;
      sVar41 = (this->super_ON_SubDMeshFragment).m_P_stride;
      pdVar34 = src->m_P;
      if (uVar27 == 0) {
        pdVar34 = pdVar39;
      }
      pdVar31 = (this->super_ON_SubDMeshFragment).m_P;
      sVar37 = 0;
      if (uVar27 != 0) {
        sVar37 = src->m_P_stride;
      }
      pdVar2 = pdVar31 + sVar41 * vertex_capacity;
      pdVar34 = pdVar34 + 2;
      for (; pdVar31 < pdVar2; pdVar31 = pdVar31 + sVar41) {
        *pdVar31 = pdVar34[-2];
        pdVar31[1] = pdVar34[-1];
        pdVar31[2] = *pdVar34;
        pdVar34 = pdVar34 + sVar37;
      }
      if (bVar14) {
        sVar41 = 0;
      }
      else {
        sVar41 = src->m_N_stride;
      }
      uVar27 = ON_SubDMeshFragment::NormalCapacity(&this->super_ON_SubDMeshFragment);
      if (uVar42 <= uVar27) {
        if (!bVar14) {
          pdVar39 = src->m_N;
        }
        pdVar31 = (this->super_ON_SubDMeshFragment).m_N;
        sVar37 = (this->super_ON_SubDMeshFragment).m_N_stride;
        pdVar34 = pdVar31 + sVar37 * vertex_capacity;
        pdVar39 = pdVar39 + 2;
        for (; pdVar31 < pdVar34; pdVar31 = pdVar31 + sVar37) {
          *pdVar31 = pdVar39[-2];
          pdVar31[1] = pdVar39[-1];
          pdVar31[2] = *pdVar39;
          pdVar39 = pdVar39 + sVar41;
        }
      }
      if (bVar26) {
        pdVar39 = nan3;
        sVar41 = 0;
      }
      else {
        pdVar39 = src->m_T;
        sVar41 = src->m_T_stride;
        ON_SubDMeshFragment::SetTextureCoordinatesExistForExperts
                  (&this->super_ON_SubDMeshFragment,true);
      }
      uVar27 = ON_SubDMeshFragment::TextureCoordinateCapacity(&this->super_ON_SubDMeshFragment);
      if (uVar42 <= uVar27) {
        pdVar31 = (this->super_ON_SubDMeshFragment).m_T;
        sVar37 = (this->super_ON_SubDMeshFragment).m_T_stride;
        pdVar34 = pdVar31 + sVar37 * vertex_capacity;
        pdVar39 = pdVar39 + 2;
        for (; pdVar31 < pdVar34; pdVar31 = pdVar31 + sVar37) {
          *pdVar31 = pdVar39[-2];
          pdVar31[1] = pdVar39[-1];
          pdVar31[2] = *pdVar39;
          pdVar39 = pdVar39 + sVar41;
        }
      }
      if (!bVar16 && uVar42 <= uVar29) {
        pOVar38 = src->m_K;
        sVar41 = src->m_K_stride;
        puVar1 = &(this->super_ON_SubDMeshFragment).m_vertex_capacity_etc;
        *puVar1 = *puVar1 | 0x4000;
      }
      else {
        pOVar38 = &ON_SurfaceCurvature::Nan;
        sVar41 = 0;
      }
      uVar27 = ON_SubDMeshFragment::CurvatureCapacity(&this->super_ON_SubDMeshFragment);
      if (uVar42 <= uVar27) {
        pOVar32 = (this->super_ON_SubDMeshFragment).m_K;
        pOVar35 = pOVar32 + (this->super_ON_SubDMeshFragment).m_K_stride * vertex_capacity;
        for (; pOVar32 < pOVar35; pOVar32 = pOVar32 + (this->super_ON_SubDMeshFragment).m_K_stride)
        {
          dVar5 = pOVar38->k2;
          pOVar32->k1 = pOVar38->k1;
          pOVar32->k2 = dVar5;
          pOVar38 = pOVar38 + sVar41;
        }
      }
      if (!bVar17 && uVar42 <= uVar30) {
        pOVar40 = src->m_C;
        sVar41 = src->m_C_stride;
        puVar1 = &(this->super_ON_SubDMeshFragment).m_vertex_capacity_etc;
        *puVar1 = *puVar1 | 0x2000;
      }
      else {
        pOVar40 = &ON_Color::UnsetColor;
        sVar41 = 0;
      }
      uVar27 = ON_SubDMeshFragment::ColorCapacity(&this->super_ON_SubDMeshFragment);
      if (uVar42 <= uVar27) {
        paVar33 = &((this->super_ON_SubDMeshFragment).m_C)->field_0;
        paVar3 = paVar33 + vertex_capacity * (this->super_ON_SubDMeshFragment).m_C_stride;
        for (; paVar33 < paVar3; paVar33 = paVar33 + (this->super_ON_SubDMeshFragment).m_C_stride) {
          *paVar33 = pOVar40->field_0;
          pOVar40 = (ON_Color *)(&pOVar40->field_0 + sVar41);
        }
      }
    }
  }
  return;
}

Assistant:

void ON_SubDManagedMeshFragment::CopyHelper(const ON_SubDMeshFragment& src)
{
  // This makes an exact copy. 
  // See ON_SubDMeshFragment::CopyFrom() can copy high density to low density

  if (this == &src)
    return;
  
  ON_SubDMeshFragment::Clear();

  const size_t vertex_capacity = src.VertexCount();
  if (0 == vertex_capacity)
    return;

  const unsigned P_count = src.PointCount();
  if (0 != P_count && vertex_capacity != P_count)
  {
    ON_SUBD_ERROR("invalid counts");
    return;
  }

  unsigned N_count = src.NormalCount();
  if (0 != N_count && vertex_capacity != N_count)
  {
    ON_SUBD_ERROR("invalid src.NormalCount()");
    N_count = 0;
  }

  unsigned T_count = src.TextureCoordinateCount();
  if (0 != T_count && vertex_capacity != T_count)
  {
    ON_SUBD_ERROR("invalid src.TextureCoordinateCount()");
    T_count = 0;
  }

  unsigned K_count = src.CurvatureCount();
  if (0 != K_count && vertex_capacity != K_count)
  {
    ON_SUBD_ERROR("invalid src.CurvatureCount()");
    K_count = 0;
  }

  unsigned C_count = src.ColorCount();
  if (0 != C_count && vertex_capacity != C_count)
  {
    ON_SUBD_ERROR("invalid src.ColorCount()");
    C_count = 0;
  }


  if (vertex_capacity > this->VertexCapacity())
  {
    if (this->UnmanagedArrays() && this->VertexCapacity() > 0)
    {
      ON_SUBD_ERROR("unmanaged array capacity is too small.");
      return;
    }
    
    if (this->ManagedArrays())
      this->DeleteManagedArrays();

    // allocate managed arrays
    m_vertex_count_etc = 0;
    m_vertex_capacity_etc = 0;
    m_P = nullptr;
    this->Internal_LayoutArrays(vertex_capacity, nullptr);
  }

  if (this->TextureCoordinateCapacity() < vertex_capacity)
    T_count = 0;
  if (this->CurvatureCapacity() < vertex_capacity)
    K_count = 0;
  if (this->ColorCapacity() < vertex_capacity)
    C_count = 0;

  SetVertexCount(vertex_capacity);

  if (src.m_vertex_count_etc & ON_SubDMeshFragment::EtcControlNetQuadBit)
  {
    m_vertex_count_etc |= ON_SubDMeshFragment::EtcControlNetQuadBit;
  } 
  else
  {
    m_vertex_count_etc &= ~ON_SubDMeshFragment::EtcControlNetQuadBit;
  }

  if (T_count > 0)
  {
    m_ctrlnetT[0][0] = src.m_ctrlnetT[0][0];
    m_ctrlnetT[0][1] = src.m_ctrlnetT[0][1];
    m_ctrlnetT[0][2] = src.m_ctrlnetT[0][2];
    m_ctrlnetT[1][0] = src.m_ctrlnetT[1][0];
    m_ctrlnetT[1][1] = src.m_ctrlnetT[1][1];
    m_ctrlnetT[1][2] = src.m_ctrlnetT[1][2];
    m_ctrlnetT[2][0] = src.m_ctrlnetT[2][0];
    m_ctrlnetT[2][1] = src.m_ctrlnetT[2][1];
    m_ctrlnetT[2][2] = src.m_ctrlnetT[2][2];
    m_ctrlnetT[3][0] = src.m_ctrlnetT[3][0];
    m_ctrlnetT[3][1] = src.m_ctrlnetT[3][1];
    m_ctrlnetT[3][2] = src.m_ctrlnetT[3][2];
  }

  if (K_count > 0)
  {
    m_ctrlnetK[0] = src.m_ctrlnetK[0];
    m_ctrlnetK[1] = src.m_ctrlnetK[1];
    m_ctrlnetK[2] = src.m_ctrlnetK[2];
    m_ctrlnetK[3] = src.m_ctrlnetK[3];
  }

  if (C_count > 0)
  {
    m_ctrlnetC[0] = src.m_ctrlnetC[0];
    m_ctrlnetC[1] = src.m_ctrlnetC[1];
    m_ctrlnetC[2] = src.m_ctrlnetC[2];
    m_ctrlnetC[3] = src.m_ctrlnetC[3];
  }

  m_pack_rect[0][0] = src.m_pack_rect[0][0];
  m_pack_rect[0][1] = src.m_pack_rect[0][1];
  m_pack_rect[1][0] = src.m_pack_rect[1][0];
  m_pack_rect[1][1] = src.m_pack_rect[1][1];
  m_pack_rect[2][0] = src.m_pack_rect[2][0];
  m_pack_rect[2][1] = src.m_pack_rect[2][1];
  m_pack_rect[3][0] = src.m_pack_rect[3][0];
  m_pack_rect[3][1] = src.m_pack_rect[3][1];

  this->m_surface_bbox = src.m_surface_bbox;
  this->m_grid = src.m_grid;

  ON_3dPoint quad_points[4];
  ON_3dVector quad_normal;
  src.GetControlNetQuad(false, quad_points, quad_normal);
  this->SetControlNetQuad(false, quad_points, quad_normal);


  const double nan3[3] = { ON_DBL_QNAN, ON_DBL_QNAN, ON_DBL_QNAN };
  const double* src_p;
  size_t src_p_stride;
  double* p;
  double* p1;

  // copy src.m_P[] to m_P[]
  p = m_P;
  p1 = p + (m_P_stride * vertex_capacity);
  if ( P_count > 0 )
  {
    src_p = src.m_P;
    src_p_stride = src.m_P_stride;
  }
  else
  {
    src_p = nan3;
    src_p_stride = 0;
  }
  while (p < p1)
  {
    p[0] = src_p[0];
    p[1] = src_p[1];
    p[2] = src_p[2];
    p += m_P_stride;
    src_p += src_p_stride;
  }

  // copy src.m_N[] to m_N[]
  if (N_count > 0)
  {
    src_p = src.m_N;
    src_p_stride = src.m_N_stride;
  }
  else
  {
    // Pierre, 2023-04-13: Set to Nan when empty source, to stay similar to ON_SubDMeshFragment::CopyFrom()
    src_p = nan3;
    src_p_stride = 0;
  }
  if (this->NormalCapacity() >= vertex_capacity)
  {
    p = m_N;
    p1 = p + (m_N_stride * vertex_capacity);
    while (p < p1)
    {
      p[0] = src_p[0];
      p[1] = src_p[1];
      p[2] = src_p[2];
      p += m_N_stride;
      src_p += src_p_stride;
    }
  }

  // copy src.m_T[] to m_T[]
  if (T_count > 0)
  {
    src_p = src.m_T;
    src_p_stride = src.m_T_stride;
    SetTextureCoordinatesExistForExperts(true);
  }
  else
  {
    // set m_T[] to nans
    src_p = nan3;
    src_p_stride = 0;
  }
  if (this->TextureCoordinateCapacity() >= vertex_capacity)
  {
    p = m_T;
    p1 = p + (m_T_stride * vertex_capacity);
    while (p < p1)
    {
      p[0] = src_p[0];
      p[1] = src_p[1];
      p[2] = src_p[2];
      p += m_T_stride;
      src_p += src_p_stride;
    }
  }

  // copy src.m_K[] to m_K[]
  const ON_SurfaceCurvature* src_k;
  size_t src_k_stride;
  if (K_count > 0)
  {
    // copy curvature
    src_k = src.m_K;
    src_k_stride = src.m_K_stride;
    SetCurvaturesExistForExperts(true);
  }
  else
  {
    src_k = &ON_SurfaceCurvature::Nan;
    src_k_stride = 0;
  }
  if (this->CurvatureCapacity() >= vertex_capacity)
  {
    ON_SurfaceCurvature* k = m_K;
    ON_SurfaceCurvature* k1 = k + (m_K_stride * vertex_capacity);
    while (k < k1)
    {
      *k = *src_k;
      k += m_K_stride;
      src_k += src_k_stride;
    }
  }

  // copy src.m_C[] to m_C[]
  const ON_Color* src_c;
  size_t src_c_stride;
  if (C_count > 0)
  {
    src_c = src.m_C;
    src_c_stride = src.m_C_stride;
    SetColorsExistForExperts(true);
  }
  else
  {
    src_c = &ON_Color::UnsetColor;
    src_c_stride = 0;
  }
  if (this->ColorCapacity() >= vertex_capacity)
  {
    ON_Color* c = m_C;
    ON_Color* c1 = c + (m_C_stride * vertex_capacity);
    while (c < c1)
    {
      *c = *src_c;
      c += m_C_stride;
      src_c += src_c_stride;
    }
  }


}